

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool rest_tx(any *context,HTTPRequest *req,string *strURIPart)

{
  long lVar1;
  string str;
  span<const_std::byte,_18446744073709551615UL> reply;
  span<const_std::byte,_18446744073709551615UL> reply_00;
  bool bVar2;
  RESTResponseFormat RVar3;
  NodeContext *pNVar4;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long in_FS_OFFSET;
  string_view str_00;
  span<const_std::byte,_18446744073709551615UL> reply_01;
  Span<const_unsigned_char> s;
  char (*in_stack_fffffffffffffe08) [42];
  undefined8 uStack_1f0;
  CTransactionRef tx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 *local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [16];
  DataStream ssTx;
  string local_138;
  undefined1 local_118 [32];
  string strHex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  uint256 local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  optional<uint256> hash;
  string hashStr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CheckWarmup(req);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_0025b4fd;
  }
  hashStr._M_dataplus._M_p = (pointer)&hashStr.field_2;
  hashStr._M_string_length = 0;
  hashStr.field_2._M_local_buf[0] = '\0';
  RVar3 = ParseDataFormat(&hashStr,strURIPart);
  str_00._M_str = in_RCX;
  str_00._M_len = (size_t)hashStr._M_dataplus._M_p;
  detail::FromHex<uint256>(&hash,(detail *)hashStr._M_string_length,str_00);
  if (hash.super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == false) {
    std::operator+(&local_90,"Invalid hash: ",&hashStr);
    RESTERR(req,HTTP_BAD_REQUEST,&local_90);
    pbVar5 = &local_90;
LAB_0025b1f1:
    std::__cxx11::string::~string((string *)pbVar5);
    bVar2 = false;
  }
  else {
    if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
        g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
        super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
        super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
      BaseIndex::BlockUntilSyncedToCurrentChain
                ((BaseIndex *)
                 g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
                 super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
                 super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl);
    }
    pNVar4 = util::AnyPtr<node::NodeContext>(context);
    if (pNVar4 == (NodeContext *)0x0) {
      local_b8.super_base_blob<256U>.m_data._M_elems._0_4_ = 0x5d;
      tinyformat::format<char[82],int,char[15],char[42]>
                ((string *)&ssTx,
                 (tinyformat *)
                 "%s:%d (%s)\nInternal bug detected: Node context not found!\nYou may report this issue here: %s\n"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rest.cpp"
                 ,(char (*) [82])&local_b8,(int *)"GetNodeContext",
                 (char (*) [15])"https://github.com/bitcoin/bitcoin/issues",
                 in_stack_fffffffffffffe08);
      RESTERR(req,HTTP_INTERNAL_SERVER_ERROR,(string *)&ssTx);
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssTx;
      goto LAB_0025b1f1;
    }
    local_b8.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_b8.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    node::GetTransaction
              ((node *)&tx,(CBlockIndex *)0x0,
               (pNVar4->mempool)._M_t.
               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,(uint256 *)&hash,&local_b8,
               &((pNVar4->chainman)._M_t.
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman);
    if (tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::operator+(&local_d8,&hashStr," not found");
      RESTERR(req,HTTP_NOT_FOUND,&local_d8);
      pbVar5 = &local_d8;
LAB_0025b4df:
      std::__cxx11::string::~string((string *)pbVar5);
      bVar2 = false;
    }
    else {
      if (RVar3 == JSON) {
        local_1b8 = local_1a8;
        local_1b0 = 0;
        local_1a8[0] = 0;
        str._M_string_length = uStack_1f0;
        str._M_dataplus._M_p = *in_stack_fffffffffffffe08;
        str.field_2._M_allocated_capacity =
             (size_type)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        str.field_2._8_8_ =
             tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        UniValue::UniValue((UniValue *)&ssTx,VOBJ,str);
        std::__cxx11::string::~string((string *)&local_1b8);
        TxToUniv(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_b8,(UniValue *)&ssTx,true,(CTxUndo *)0x0,SHOW_DETAILS);
        UniValue::write_abi_cxx11_((UniValue *)local_118,(int)&ssTx,(void *)0x0,0);
        std::operator+(&strHex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_118,"\n");
        std::__cxx11::string::~string((string *)local_118);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_118,"Content-Type",(allocator<char> *)((long)&uStack_1f0 + 7));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"application/json",
                   (allocator<char> *)((long)&uStack_1f0 + 6));
        HTTPRequest::WriteHeader(req,(string *)local_118,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::~string((string *)local_118);
        reply_00._M_extent._M_extent_value = strHex._M_string_length;
        reply_00._M_ptr = (pointer)strHex._M_dataplus._M_p;
        HTTPRequest::WriteReply(req,200,reply_00);
        std::__cxx11::string::~string((string *)&strHex);
        UniValue::~UniValue((UniValue *)&ssTx);
      }
      else {
        if (RVar3 == HEX) {
          ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ssTx.m_read_pos = 0;
          ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          strHex._M_dataplus._M_p = "\x01";
          strHex._M_string_length = (size_type)&tx;
          ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>::
          Serialize<DataStream>
                    ((ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>
                      *)&strHex,&ssTx);
          s.m_data = ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_start + ssTx.m_read_pos;
          s.m_size = (long)ssTx.vch.
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)s.m_data;
          HexStr_abi_cxx11_((string *)local_118,s);
          std::operator+(&strHex,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_118,"\n");
          std::__cxx11::string::~string((string *)local_118);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_118,"Content-Type",(allocator<char> *)((long)&uStack_1f0 + 7));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_138,"text/plain",(allocator<char> *)((long)&uStack_1f0 + 6));
          HTTPRequest::WriteHeader(req,(string *)local_118,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)local_118);
          reply._M_extent._M_extent_value = strHex._M_string_length;
          reply._M_ptr = (pointer)strHex._M_dataplus._M_p;
          HTTPRequest::WriteReply(req,200,reply);
          std::__cxx11::string::~string((string *)&strHex);
        }
        else {
          if (RVar3 != BINARY) {
            AvailableDataFormatsString_abi_cxx11_();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ssTx,"output format not found (available: ",&strHex);
            std::operator+(&local_1d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ssTx,")");
            RESTERR(req,HTTP_NOT_FOUND,&local_1d8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&ssTx);
            pbVar5 = &strHex;
            goto LAB_0025b4df;
          }
          ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ssTx.m_read_pos = 0;
          ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          strHex._M_dataplus._M_p = "\x01";
          strHex._M_string_length = (size_type)&tx;
          ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>::
          Serialize<DataStream>
                    ((ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>
                      *)&strHex,&ssTx);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&strHex,"Content-Type",(allocator<char> *)&local_138);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_118,"application/octet-stream",
                     (allocator<char> *)((long)&uStack_1f0 + 7));
          HTTPRequest::WriteHeader(req,&strHex,(string *)local_118);
          std::__cxx11::string::~string((string *)local_118);
          std::__cxx11::string::~string((string *)&strHex);
          reply_01._M_ptr =
               ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_start + ssTx.m_read_pos;
          reply_01._M_extent._M_extent_value =
               (long)ssTx.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)reply_01._M_ptr;
          HTTPRequest::WriteReply(req,200,reply_01);
        }
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ssTx);
      }
      bVar2 = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::string::~string((string *)&hashStr);
LAB_0025b4fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_tx(const std::any& context, HTTPRequest* req, const std::string& strURIPart)
{
    if (!CheckWarmup(req))
        return false;
    std::string hashStr;
    const RESTResponseFormat rf = ParseDataFormat(hashStr, strURIPart);

    auto hash{uint256::FromHex(hashStr)};
    if (!hash) {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + hashStr);
    }

    if (g_txindex) {
        g_txindex->BlockUntilSyncedToCurrentChain();
    }

    const NodeContext* const node = GetNodeContext(context, req);
    if (!node) return false;
    uint256 hashBlock = uint256();
    const CTransactionRef tx{GetTransaction(/*block_index=*/nullptr, node->mempool.get(), *hash, hashBlock, node->chainman->m_blockman)};
    if (!tx) {
        return RESTERR(req, HTTP_NOT_FOUND, hashStr + " not found");
    }

    switch (rf) {
    case RESTResponseFormat::BINARY: {
        DataStream ssTx;
        ssTx << TX_WITH_WITNESS(tx);

        req->WriteHeader("Content-Type", "application/octet-stream");
        req->WriteReply(HTTP_OK, ssTx);
        return true;
    }

    case RESTResponseFormat::HEX: {
        DataStream ssTx;
        ssTx << TX_WITH_WITNESS(tx);

        std::string strHex = HexStr(ssTx) + "\n";
        req->WriteHeader("Content-Type", "text/plain");
        req->WriteReply(HTTP_OK, strHex);
        return true;
    }

    case RESTResponseFormat::JSON: {
        UniValue objTx(UniValue::VOBJ);
        TxToUniv(*tx, /*block_hash=*/hashBlock, /*entry=*/ objTx);
        std::string strJSON = objTx.write() + "\n";
        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, strJSON);
        return true;
    }

    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: " + AvailableDataFormatsString() + ")");
    }
    }
}